

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t exr_attr_set_string(exr_context_t ctxt,int part_index,char *name,char *val)

{
  long lVar1;
  exr_attr_string_t *s;
  int iVar2;
  exr_result_t eVar3;
  code *UNRECOVERED_JUMPTABLE;
  char *__n;
  char *pcVar4;
  undefined8 uVar5;
  char *pcVar6;
  exr_attribute_list_t *list;
  undefined8 uStackY_50;
  exr_attribute_t *attr;
  
  attr = (exr_attribute_t *)0x0;
  if ((name != (char *)0x0) && (iVar2 = strcmp(name,"name"), iVar2 == 0)) {
    eVar3 = exr_set_name(ctxt,part_index,name);
    return eVar3;
  }
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar3 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar3;
  }
  lVar1 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
  if ((name != (char *)0x0) && (iVar2 = strcmp(name,"type"), iVar2 == 0)) {
    eVar3 = (**(code **)(ctxt + 0x48))
                      (ctxt,3,"Part type attribute must be implicitly only when adding a part",
                       *(code **)(ctxt + 0x48));
    return eVar3;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uStackY_50 = 0x15;
LAB_00116933:
    eVar3 = (*UNRECOVERED_JUMPTABLE)(ctxt,uStackY_50);
    return eVar3;
  }
  if (*ctxt == (_priv_exr_context_t)0x0) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uStackY_50 = 8;
    goto LAB_00116933;
  }
  list = (exr_attribute_list_t *)(lVar1 + 8);
  eVar3 = exr_attr_list_find_by_name(ctxt,list,name,&attr);
  if (val == (char *)0x0) {
    __n = (char *)0x0;
  }
  else {
    __n = (char *)strlen(val);
    if (((ulong)__n & 0xffffffff80000000) != 0) {
      pcVar4 = "String too large to store (%lu bytes) into \'%s\'";
      uVar5 = 3;
      pcVar6 = name;
      goto LAB_00116a5c;
    }
  }
  iVar2 = (int)__n;
  if (eVar3 != 0) {
    if (eVar3 != 0xf) {
      return eVar3;
    }
    if (*ctxt == (_priv_exr_context_t)0x1) {
      eVar3 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_STRING,0,(uint8_t **)0x0,&attr);
      if (eVar3 != 0) {
        return eVar3;
      }
      eVar3 = exr_attr_string_create_with_length(ctxt,(attr->field_6).string,val,iVar2);
      return eVar3;
    }
    return 0xf;
  }
  if (attr->type == EXR_ATTR_STRING) {
    s = (attr->field_6).string;
    if ((s->length == iVar2) && (0 < s->alloc_size)) {
      if (val == (char *)0x0) {
        return 0;
      }
      memcpy(s->str,val,(size_t)__n);
      return 0;
    }
    if (*ctxt == (_priv_exr_context_t)0x1) {
      eVar3 = exr_attr_string_set_with_length(ctxt,s,val,iVar2);
      return eVar3;
    }
    eVar3 = (**(code **)(ctxt + 0x48))
                      (ctxt,0x14,
                       "Existing string \'%s\' has length %d, requested %d, unable to change",name,
                       s->length,(ulong)__n & 0xffffffff);
    return eVar3;
  }
  pcVar6 = attr->type_name;
  pcVar4 = "\'%s\' requested type \'string\', but attribute is type \'%s\'";
  uVar5 = 0x10;
  __n = name;
LAB_00116a5c:
  eVar3 = (**(code **)(ctxt + 0x48))(ctxt,uVar5,pcVar4,__n,pcVar6);
  return eVar3;
}

Assistant:

exr_result_t
exr_attr_set_string (
    exr_context_t ctxt, int part_index, const char* name, const char* val)
{
    size_t           bytes;
    exr_attribute_t* attr = NULL;
    exr_result_t     rv   = EXR_ERR_SUCCESS;

    if (name && !strcmp (name, EXR_REQ_NAME_STR))
        return exr_set_name (ctxt, part_index, name);

    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (name && !strcmp (name, EXR_REQ_TYPE_STR))
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Part type attribute must be implicitly only when adding a part"));

    if (pctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (pctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_ALREADY_WROTE_ATTRS));

    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);

    bytes = val ? strlen (val) : 0;

    if (bytes > (size_t) INT32_MAX)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "String too large to store (%" PRIu64 " bytes) into '%s'",
            (uint64_t) bytes,
            name));

    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        if (pctxt->mode != EXR_CONTEXT_WRITE)
            return EXR_UNLOCK_AND_RETURN_PCTXT (rv);

        rv = exr_attr_list_add (
            ctxt, &(part->attributes), name, EXR_ATTR_STRING, 0, NULL, &(attr));
        if (rv == EXR_ERR_SUCCESS)
            rv = exr_attr_string_create_with_length (
                ctxt, attr->string, val, (int32_t) bytes);
    }
    else if (rv == EXR_ERR_SUCCESS)
    {
        if (attr->type != EXR_ATTR_STRING)
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'%s' requested type 'string', but attribute is type '%s'",
                name,
                attr->type_name));
        if (attr->string->length == (int32_t) bytes &&
            attr->string->alloc_size > 0)
        {
            if (val)
                memcpy (EXR_CONST_CAST (void*, attr->string->str), val, bytes);
        }
        else if (pctxt->mode != EXR_CONTEXT_WRITE)
        {
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_MODIFY_SIZE_CHANGE,
                "Existing string '%s' has length %d, requested %d, unable to change",
                name,
                attr->string->length,
                (int32_t) bytes));
        }
        else
        {
            rv = exr_attr_string_set_with_length (
                ctxt, attr->string, val, (int32_t) bytes);
        }
    }
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}